

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# repeated_field.h
# Opt level: O2

void __thiscall
google::protobuf::RepeatedField<google::protobuf::UnknownField>::ExtractSubrange
          (RepeatedField<google::protobuf::UnknownField> *this,int start,int num,
          UnknownField *elements)

{
  undefined8 *puVar1;
  undefined8 uVar2;
  int iVar3;
  Nonnull<const_char_*> failure_msg;
  char *pcVar4;
  long lVar5;
  ulong uVar6;
  LogMessageFatal local_40;
  
  failure_msg = absl::lts_20250127::log_internal::Check_GEImpl(start,0,"start >= 0");
  if (failure_msg == (Nullable<const_char_*>)0x0) {
    failure_msg = absl::lts_20250127::log_internal::Check_GEImpl(num,0,"num >= 0");
    if (failure_msg == (Nullable<const_char_*>)0x0) {
      uVar6 = (this->soo_rep_).field_0.long_rep.elements_int;
      iVar3 = internal::SooRep::size(&this->soo_rep_,(uVar6 & 4) == 0);
      failure_msg = absl::lts_20250127::log_internal::Check_LEImpl
                              (num + start,iVar3,"start + num <= old_size");
      if (failure_msg == (Nullable<const_char_*>)0x0) {
        if ((uVar6 & 4) == 0) {
          pcVar4 = (char *)((long)&(this->soo_rep_).field_0 + 8);
        }
        else {
          pcVar4 = internal::LongSooRep::elements((LongSooRep *)this);
        }
        if (elements != (UnknownField *)0x0) {
          lVar5 = 0;
          uVar6 = 0;
          if (0 < num) {
            uVar6 = (ulong)(uint)num;
          }
          for (; uVar6 * 0x10 != lVar5; lVar5 = lVar5 + 0x10) {
            uVar2 = *(undefined8 *)(pcVar4 + lVar5 + (long)start * 0x10 + 8);
            puVar1 = (undefined8 *)((long)&elements->number_ + lVar5);
            *puVar1 = *(undefined8 *)(pcVar4 + lVar5 + (long)start * 0x10);
            puVar1[1] = uVar2;
          }
        }
        if (0 < num) {
          lVar5 = (long)(num + start);
          pcVar4 = pcVar4 + lVar5 * 0x10;
          for (; lVar5 < iVar3; lVar5 = lVar5 + 1) {
            uVar2 = *(undefined8 *)(pcVar4 + 8);
            *(undefined8 *)(pcVar4 + (ulong)(uint)num * -0x10) = *(undefined8 *)pcVar4;
            *(undefined8 *)(pcVar4 + (ulong)(uint)num * -0x10 + 8) = uVar2;
            pcVar4 = pcVar4 + 0x10;
          }
          Truncate(this,iVar3 - num);
          return;
        }
        return;
      }
      iVar3 = 0x3d2;
    }
    else {
      iVar3 = 0x3cf;
    }
  }
  else {
    iVar3 = 0x3ce;
  }
  absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
            (&local_40,
             "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/repeated_field.h"
             ,iVar3,failure_msg);
  absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal(&local_40);
}

Assistant:

void RepeatedField<Element>::ExtractSubrange(int start, int num,
                                             Element* elements) {
  ABSL_DCHECK_GE(start, 0);
  ABSL_DCHECK_GE(num, 0);
  const bool is_soo = this->is_soo();
  const int old_size = size(is_soo);
  ABSL_DCHECK_LE(start + num, old_size);
  Element* elem = unsafe_elements(is_soo);

  // Save the values of the removed elements if requested.
  if (elements != nullptr) {
    for (int i = 0; i < num; ++i) elements[i] = std::move(elem[i + start]);
  }

  // Slide remaining elements down to fill the gap.
  if (num > 0) {
    for (int i = start + num; i < old_size; ++i)
      elem[i - num] = std::move(elem[i]);
    Truncate(old_size - num);
  }
}